

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonProcessingFunctions.cpp
# Opt level: O1

json helics::fileops::loadJsonStr_abi_cxx11_(string_view jsonString)

{
  char *in_RDX;
  json_value jVar1;
  json_value extraout_RDX;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  bVar2;
  json jVar3;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  local_28 = (code *)0x0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  bVar2 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::parse<char_const*>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      *)jsonString._M_len,in_RDX,jsonString._M_str + (long)in_RDX,
                     (parser_callback_t *)&local_38,true,true);
  jVar1 = bVar2.m_data.m_value;
  if (local_28 != (code *)0x0) {
    (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
    jVar1 = extraout_RDX;
  }
  jVar3.m_data.m_value.string = jVar1.string;
  jVar3.m_data._0_8_ =
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        *)jsonString._M_len;
  return (json)jVar3.m_data;
}

Assistant:

nlohmann::json loadJsonStr(std::string_view jsonString)
{
    try {
        return nlohmann::json::parse(jsonString.begin(), jsonString.end(), nullptr, true, true);
    }
    catch (const nlohmann::json::parse_error& errs) {
        throw(std::invalid_argument(errs.what()));
    }
}